

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

ON_3dPoint * __thiscall
ON_3dPoint::operator*(ON_3dPoint *__return_storage_ptr__,ON_3dPoint *this,ON_Xform *xform)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ulong uVar4;
  double dVar5;
  
  dVar1 = this->x;
  dVar2 = this->y;
  dVar3 = this->z;
  dVar5 = dVar3 * xform->m_xform[2][3] + dVar1 * xform->m_xform[0][3] + dVar2 * xform->m_xform[1][3]
          + xform->m_xform[3][3];
  uVar4 = -(ulong)(dVar5 != 0.0);
  dVar5 = (double)(~uVar4 & 0x3ff0000000000000 | (ulong)(1.0 / dVar5) & uVar4);
  ON_3dPoint(__return_storage_ptr__,
             (xform->m_xform[2][0] * dVar3 +
              xform->m_xform[0][0] * dVar1 + xform->m_xform[1][0] * dVar2 + xform->m_xform[3][0]) *
             dVar5,(xform->m_xform[2][1] * dVar3 +
                    xform->m_xform[0][1] * dVar1 + xform->m_xform[1][1] * dVar2 +
                   xform->m_xform[3][1]) * dVar5,
             dVar5 * (xform->m_xform[2][2] * dVar3 +
                      xform->m_xform[0][2] * dVar1 + xform->m_xform[1][2] * dVar2 +
                     xform->m_xform[3][2]));
  return __return_storage_ptr__;
}

Assistant:

ON_3dPoint ON_3dPoint::operator*( const ON_Xform& xform ) const
{
  const double px = x; // optimizer should put px,py,pz in registers
  const double py = y;
  const double pz = z;
  double hx[3], w;
  const double* m = &xform.m_xform[0][0];
  hx[0] = m[0]*px + m[4]*py + m[ 8]*pz + m[12];
  hx[1] = m[1]*px + m[5]*py + m[ 9]*pz + m[13];
  hx[2] = m[2]*px + m[6]*py + m[10]*pz + m[14];
  w     = m[3]*px + m[7]*py + m[11]*pz + m[15];
  w = (w != 0.0) ? 1.0/w : 1.0;
  return ON_3dPoint( w*hx[0], w*hx[1], w*hx[2] );
}